

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateDFD(ValidationContext *this)

{
  __array _Var1;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  string *psVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  uint uVar9;
  ulong *puVar10;
  uint32_t numBlocks;
  uint local_9c;
  uint local_98;
  ktx_uint32_t dfdByteLength;
  __array buffer;
  size_t remainingDFDBytes;
  uint numSamplesStored;
  uint32_t dfdTotalSize;
  string local_78;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> samples;
  
  uVar7 = (ulong)(this->header).dataFormatDescriptor.byteOffset;
  dfdByteLength = (this->header).dataFormatDescriptor.byteLength;
  if (dfdByteLength != 0 && uVar7 != 0) {
    uVar6 = (ulong)dfdByteLength;
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(uVar6);
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar6);
    buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (*this->_vptr_ValidationContext[2])
              (this,uVar7,
               __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar6,7,"the DFD");
    _Var1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar7 = (ulong)dfdByteLength;
    dfdTotalSize = *(uint32_t *)
                    buffer._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (dfdByteLength != dfdTotalSize) {
      error<unsigned_int_const&,unsigned_int&>(this,&DFD::SizeMismatch,&dfdByteLength,&dfdTotalSize)
      ;
    }
    puVar8 = (ulong *)(uVar7 + (long)_Var1._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    puVar10 = (ulong *)((long)_Var1._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4);
    numBlocks = 0;
    local_9c = 0;
    while( true ) {
      if (puVar8 <= puVar10) break;
      remainingDFDBytes = (long)puVar8 - (long)puVar10;
      uVar4 = numBlocks + 1;
      if (10 < uVar4) {
        numBlocks = uVar4;
        warning<unsigned_int&,unsigned_long_const&>
                  (this,&DFD::TooManyDFDBlocks,&numBlocks,&remainingDFDBytes);
        break;
      }
      if (remainingDFDBytes < 8) {
        numBlocks = uVar4;
        error<unsigned_long_const&>(this,&DFD::NotEnoughDataForBlockHeader,&remainingDFDBytes);
        break;
      }
      uVar7 = *puVar10;
      uVar9 = (uint)(ushort)(uVar7 >> 0x30);
      if (uVar7 < 0x8000000000000) {
        local_78._M_dataplus._M_p._0_4_ = uVar9;
        numBlocks = uVar4;
        error<unsigned_int&,int>(this,&DFD::DescriptorBlockSizeTooSmall,&numBlocks,(int *)&local_78)
        ;
      }
      else if (remainingDFDBytes < uVar7 >> 0x30) {
        local_78._M_dataplus._M_p._0_4_ = uVar9;
        numBlocks = uVar4;
        error<unsigned_int&,int,unsigned_long_const&>
                  (this,&DFD::DescriptorBlockSizeTooBig,&numBlocks,(int *)&local_78,
                   &remainingDFDBytes);
      }
      else {
        uVar5 = (uint)uVar7 & 0x1ffff;
        uVar6 = uVar7 & 0xfffe0000;
        if (uVar6 == 0 && (uVar7 & 0x1ffff) == 0) {
          if ((local_9c & 1) == 0) {
            if ((uint)(uVar7 >> 0x33) < 3) {
              local_78._M_dataplus._M_p._0_4_ = uVar9;
              numBlocks = uVar4;
              error<unsigned_int&,int>
                        (this,&DFD::BasicDescriptorBlockSizeTooSmall,&numBlocks,(int *)&local_78);
              uVar2 = extraout_RAX;
            }
            else {
              if (numBlocks != 0) {
                local_9c = 0;
                numBlocks = uVar4;
                goto LAB_00188de4;
              }
              local_78._M_dataplus._M_p = (pointer)*puVar10;
              local_78._M_string_length = puVar10[1];
              local_78.field_2._M_allocated_capacity = puVar10[2];
              numBlocks = uVar4;
              if (((ulong)local_78._M_dataplus._M_p & 0xf000000000000) != 0x8000000000000) {
                samples.super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(samples.
                                       super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)(ushort)((ulong)local_78._M_dataplus._M_p >> 0x30));
                error<unsigned_int&,int>
                          (this,&DFD::BasicDescriptorBlockSizeInvalid,&numBlocks,(int *)&samples);
              }
              uVar5 = (ushort)((ulong)local_78._M_dataplus._M_p >> 0x30) - 0x18;
              numSamplesStored = uVar5 >> 4;
              uVar4 = 0x10;
              if (uVar5 < 0x100) {
                uVar4 = numSamplesStored;
              }
              if (0x10f < uVar5) {
                local_98 = numSamplesStored - uVar4;
                samples.super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)((((ulong)local_78._M_dataplus._M_p >> 0x30) - (ulong)(uVar4 << 4)) +
                              -0x18);
                warning<unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_int,unsigned_long>
                          (this,&DFD::TooManySamples,&numBlocks,&numSamplesStored,
                           &MAX_NUM_BDFD_SAMPLES,&local_98,(unsigned_long *)&samples);
              }
              std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::vector
                        ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                         &samples.
                          super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>,
                         (ulong)uVar4,(allocator_type *)&local_98);
              memcpy(samples.super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>.
                     _M_impl.super__Vector_impl_data._M_start,puVar10 + 3,(ulong)(uVar4 << 4));
              validateDFDBasic(this,numBlocks,
                               (uint32_t *)
                               buffer._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                               (BDFD *)&local_78,
                               (vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                               &samples.
                                super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                              );
              std::_Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>::~_Vector_base
                        (&samples.
                          super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>);
              uVar2 = extraout_RAX_00;
            }
            local_9c = (uint)CONCAT71((int7)((ulong)uVar2 >> 8),1);
          }
          else {
            local_9c = (uint)CONCAT71((uint7)(uint3)(numBlocks >> 8),1);
            numBlocks = uVar4;
            warning<unsigned_int&>(this,&DFD::MultipleBDFD,&numBlocks);
          }
        }
        else if (((uVar7 & 0x1ffff) != 0) ||
                (numBlocks = uVar4, uVar6 != 0xc0040000 && uVar6 != 0xc0020000)) {
          psVar3 = &local_78;
          numBlocks = uVar4;
          toString_abi_cxx11_(&local_78,(ktx *)(ulong)uVar5,
                              (khr_df_vendorid_e)CONCAT71(0xc00200,uVar6 == 0xc0020000));
          toString_abi_cxx11_((string *)&samples,(ktx *)(ulong)uVar5,(uint)uVar7 >> 0x11,
                              (khr_df_khr_descriptortype_e)psVar3);
          warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
                    (this,&DFD::UnknownDFDBlock,&numBlocks,&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samples);
          std::__cxx11::string::~string((string *)&samples);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
LAB_00188de4:
      uVar6 = 8;
      if (8 < uVar9) {
        uVar6 = uVar7 >> 0x30;
      }
      puVar10 = (ulong *)((long)puVar10 + uVar6);
    }
    if ((local_9c & 1) == 0) {
      error<>(this,&DFD::MissingBDFD);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buffer);
  }
  return;
}

Assistant:

void ValidationContext::validateDFD() {
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;

    if (dfdByteOffset == 0 || dfdByteLength == 0)
        return; // There is no DFD block

    const auto buffer = std::make_unique<uint8_t[]>(dfdByteLength);
    read(dfdByteOffset, buffer.get(), dfdByteLength, "the DFD");
    const auto* ptrDFD = buffer.get();
    const auto* ptrDFDEnd = ptrDFD + dfdByteLength;
    const auto* ptrDFDIt = ptrDFD;

    uint32_t dfdTotalSize;
    std::memcpy(&dfdTotalSize, ptrDFDIt, sizeof(uint32_t));
    ptrDFDIt += sizeof(uint32_t);

    if (dfdByteLength != dfdTotalSize)
        error(DFD::SizeMismatch, dfdByteLength, dfdTotalSize);

    uint32_t numBlocks = 0;
    bool foundBDFD = false;

    while (ptrDFDIt < ptrDFDEnd) {
        const auto remainingDFDBytes = static_cast<std::size_t>(ptrDFDEnd - ptrDFDIt);

        if (++numBlocks > MAX_NUM_DFD_BLOCKS) {
            warning(DFD::TooManyDFDBlocks, numBlocks, remainingDFDBytes);
            break;
        }

        DFDHeader blockHeader{};
        if (remainingDFDBytes < sizeof(DFDHeader)) {
            error(DFD::NotEnoughDataForBlockHeader, remainingDFDBytes);
            break;
        }

        std::memcpy(&blockHeader, ptrDFDIt, sizeof(DFDHeader));

        if (blockHeader.descriptorBlockSize < sizeof(DFDHeader)) {
            error(DFD::DescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

        } else if (blockHeader.descriptorBlockSize > remainingDFDBytes) {
            error(DFD::DescriptorBlockSizeTooBig, numBlocks, +blockHeader.descriptorBlockSize, remainingDFDBytes);

        } else {
            if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
                if (std::exchange(foundBDFD, true)) {
                    warning(DFD::MultipleBDFD, numBlocks);

                } else if (blockHeader.descriptorBlockSize < sizeof(BDFD)) {
                    error(DFD::BasicDescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

                } else if (numBlocks != 1) {
                    // The Basic DFD block has to be the first block.
                    foundBDFD = false;

                } else {
                    BDFD block{};
                    std::memcpy(&block, ptrDFDIt, sizeof(BDFD));

                    if ((block.descriptorBlockSize - 24) % 16 != 0)
                         error(DFD::BasicDescriptorBlockSizeInvalid, numBlocks, +block.descriptorBlockSize);

                    const auto numSamplesStored = (block.descriptorBlockSize - 24u) / 16u;
                    const auto numSamplesValidating = std::min(MAX_NUM_BDFD_SAMPLES, numSamplesStored);

                    if (numSamplesStored > MAX_NUM_BDFD_SAMPLES)
                        warning(DFD::TooManySamples, numBlocks, numSamplesStored, MAX_NUM_BDFD_SAMPLES,
                                numSamplesStored - numSamplesValidating,
                                block.descriptorBlockSize - sizeof(BDFD) - numSamplesValidating * sizeof(SampleType));

                    // Samples are located at the end of the block
                    std::vector<SampleType> samples(numSamplesValidating);
                    std::memcpy(samples.data(), ptrDFDIt + sizeof(BDFD), numSamplesValidating * sizeof(SampleType));

                    validateDFDBasic(numBlocks, reinterpret_cast<uint32_t*>(buffer.get()), block, samples);
                }

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
                // TODO: Implement DFD validation for ADDITIONAL_DIMENSIONS

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
                // TODO: Implement DFD validation for ADDITIONAL_PLANES

            } else {
                warning(DFD::UnknownDFDBlock,
                        numBlocks,
                        toString(khr_df_vendorid_e(blockHeader.vendorId)),
                        toString(khr_df_vendorid_e(blockHeader.vendorId), khr_df_khr_descriptortype_e(blockHeader.descriptorType)));
            }
        }

        ptrDFDIt += std::max(blockHeader.descriptorBlockSize, 8u);
    }

    if (!foundBDFD)
        error(DFD::MissingBDFD);
}